

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::testActiveProgramUniform
          (SeparateShaderTest *this,
          MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
          *pipeOut)

{
  CallLogWrapper *this_00;
  Random *rnd;
  ostringstream *poVar1;
  undefined8 uVar2;
  ProgramParams PVar3;
  bool condition;
  deUint32 seed;
  GLuint GVar4;
  GLint location;
  GLint location_00;
  ProgramParams PVar5;
  ProgramParams PVar6;
  ProgramPipeline pipeline;
  Surface resultSurface;
  Surface refSurface;
  ProgramParams refPp;
  ProgramParams changePp;
  ProgramPipeline local_210;
  Surface local_200;
  Surface local_1e8;
  ProgramParams local_1d0;
  undefined1 local_1c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0 [6];
  ios_base local_148 [264];
  undefined1 local_40 [8];
  deUint32 local_38;
  GLfloat GStack_34;
  
  rnd = &this->m_rnd;
  PVar5 = genProgramParams(rnd);
  local_1d0 = PVar5;
  tcu::Surface::Surface(&local_1e8);
  tcu::Surface::Surface(&local_200);
  seed = deRandom_getUint32(&rnd->m_rnd);
  createReferenceProgram
            ((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
              *)local_1c0,this,&local_1d0);
  uVar2 = local_1c0._0_8_;
  GVar4 = (*(*(_func_int ***)local_1c0._0_8_)[2])(local_1c0._0_8_);
  this_00 = &this->super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(this_00,GVar4);
  local_1c0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1c0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"// Use reference program ",0x19);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_148);
  drawSurface(this,&local_1e8,seed);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  (*(*(_func_int ***)uVar2)[1])(uVar2);
  PVar6 = genProgramParams(rnd);
  stack0xffffffffffffffc4 = PVar6._4_12_;
  local_40._0_4_ = PVar5.vtxSeed;
  PVar3 = _local_40;
  GStack_34 = PVar6.frgScale;
  local_40 = PVar3._0_8_;
  local_38 = PVar5.frgSeed;
  createReferenceProgram
            ((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
              *)local_1c0,this,(ProgramParams *)local_40);
  uVar2 = local_1c0._0_8_;
  GVar4 = (*(code *)(*(_func_int ***)local_1c0._0_8_)[2])(local_1c0._0_8_);
  glu::ProgramPipeline::ProgramPipeline(&local_210,((this->super_TestCase).m_context)->m_renderCtx);
  location = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"vtxScale");
  location_00 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"frgScale");
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glBindProgramPipeline(this_00,local_210.m_pipeline);
  (this->super_CallLogWrapper).m_enableLog = false;
  glu::ProgramPipeline::activeShaderProgram(&local_210,GVar4);
  local_1c0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1c0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"// Set active shader program to ",0x20);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_148);
  glu::CallLogWrapper::glUniform1f(this_00,location,PVar5.vtxScale);
  local_1c0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1c0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"// Set uniform \'vtxScale\' to ",0x1d);
  std::ostream::_M_insert<double>((double)PVar5.vtxScale);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," using glUniform1f",0x12);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_148);
  glu::CallLogWrapper::glUniform1f(this_00,location_00,PVar5.frgScale);
  local_1c0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1c0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"// Set uniform \'frgScale\' to ",0x1d);
  std::ostream::_M_insert<double>((double)PVar5.frgScale);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," using glUniform1f",0x12);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_148);
  glu::ProgramPipeline::activeShaderProgram(&local_210,0);
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glBindProgramPipeline(this_00,0);
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glUseProgram(this_00,GVar4);
  (this->super_CallLogWrapper).m_enableLog = false;
  drawSurface(this,&local_200,seed);
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glUseProgram(this_00,0);
  (this->super_CallLogWrapper).m_enableLog = false;
  glu::ProgramPipeline::~ProgramPipeline(&local_210);
  (*(*(_func_int ***)uVar2)[1])(uVar2);
  condition = tcu::fuzzyCompare(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                                m_log,"Active program uniform result",
                                "Active program uniform result",&local_1e8,&local_200,0.05,
                                COMPARE_LOG_RESULT);
  local_1c0._0_8_ = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c0,
             "glUniform() did not correctly modify the active program of the bound pipeline","");
  tcu::ResultCollector::check(&this->m_status,condition,(string *)local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._0_8_ != local_1b0) {
    operator_delete((void *)local_1c0._0_8_,local_1b0[0]._M_allocated_capacity + 1);
  }
  tcu::Surface::~Surface(&local_200);
  tcu::Surface::~Surface(&local_1e8);
  return;
}

Assistant:

void SeparateShaderTest::testActiveProgramUniform (MovePtr<Pipeline>& pipeOut)
{
	ProgramParams				refPp			= genProgramParams(m_rnd);
	Surface						refSurface;
	Surface						resultSurface;
	deUint32					drawSeed		= m_rnd.getUint32();

	DE_UNREF(pipeOut);
	{
		UniquePtr<ProgramWrapper>	refProg		(createReferenceProgram(refPp));
		GLuint						refProgName	= refProg->getProgramName();

		glUseProgram(refProgName);
		log() << TestLog::Message << "// Use reference program " << refProgName
			  << TestLog::EndMessage;
		drawSurface(refSurface, drawSeed);
		glUseProgram(0);
	}

	{
		ProgramParams				changePp	= genProgramParams(m_rnd);
		changePp.vtxSeed						= refPp.vtxSeed;
		changePp.frgSeed						= refPp.frgSeed;
		UniquePtr<ProgramWrapper>	changeProg	(createReferenceProgram(changePp));
		GLuint						changeName	= changeProg->getProgramName();
		ProgramPipeline				pipeline	(getRenderContext());
		GLint						vtxLoc		= glGetUniformLocation(changeName, "vtxScale");
		GLint						frgLoc		= glGetUniformLocation(changeName, "frgScale");

		LOG_CALL(glBindProgramPipeline(pipeline.getPipeline()));

		pipeline.activeShaderProgram(changeName);
		log() << TestLog::Message << "// Set active shader program to " << changeName
			  << TestLog::EndMessage;

		glUniform1f(vtxLoc, refPp.vtxScale);
		log() << TestLog::Message
			  << "// Set uniform 'vtxScale' to " << refPp.vtxScale << " using glUniform1f"
			  << TestLog::EndMessage;
		glUniform1f(frgLoc, refPp.frgScale);
		log() << TestLog::Message
			  << "// Set uniform 'frgScale' to " << refPp.frgScale << " using glUniform1f"
			  << TestLog::EndMessage;

		pipeline.activeShaderProgram(0);
		LOG_CALL(glBindProgramPipeline(0));

		LOG_CALL(glUseProgram(changeName));
		drawSurface(resultSurface, drawSeed);
		LOG_CALL(glUseProgram(0));
	}

	bool result = tcu::fuzzyCompare(
		m_testCtx.getLog(), "Active program uniform result",
		"Active program uniform result",
		refSurface, resultSurface, 0.05f, tcu::COMPARE_LOG_RESULT);

	m_status.check(result,
				   "glUniform() did not correctly modify "
				   "the active program of the bound pipeline");
}